

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

KINT32 __thiscall KDIS::NETWORK::Connection::SendPDU(Connection *this,Header *H)

{
  pointer ppCVar1;
  KUINT16 KVar2;
  int iVar3;
  KOCTET *pKVar4;
  pointer ppCVar5;
  KDataStream stream;
  
  ppCVar1 = (this->m_vpSubscribers).
            super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppCVar5 = (this->m_vpSubscribers).
                 super__Vector_base<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppCVar5 != ppCVar1;
      ppCVar5 = ppCVar5 + 1) {
    (**(code **)(*(long *)*ppCVar5 + 0x20))(*ppCVar5,H);
  }
  KDataStream::KDataStream(&stream,Big_Endian);
  (*(H->super_Header6)._vptr_Header6[5])(H,&stream);
  pKVar4 = KDataStream::GetBufferPtr(&stream);
  KVar2 = KDataStream::GetBufferSize(&stream);
  iVar3 = (*this->_vptr_Connection[0xd])(this,pKVar4,(ulong)KVar2);
  KDataStream::~KDataStream(&stream);
  return iVar3;
}

Assistant:

KINT32 Connection::SendPDU(Header *H) noexcept(false)
{
    // First lets fire the events, then send the PDU.
    vector<ConnectionSubscriber*>::iterator itr = m_vpSubscribers.begin();
    vector<ConnectionSubscriber*>::iterator itrEnd = m_vpSubscribers.end();
    for( ; itr != itrEnd; ++itr )
    {
        ( *itr )->OnPDUTransmit( H );
    }

    // Now send the PDU
    KDataStream stream;
    H->Encode( stream );
    return Send( stream.GetBufferPtr(), stream.GetBufferSize() );
}